

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

long proto2num(OperationConfig *config,long *val,char *str)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  char *__s;
  byte *pbVar4;
  long *plVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  
  lVar6 = 1;
  if (str != (char *)0x0) {
    __s = strdup(str);
    if (__s != (char *)0x0) {
      pbVar4 = (byte *)strtok(__s,",");
LAB_00117d57:
      if (pbVar4 != (byte *)0x0) {
        do {
          bVar8 = false;
          iVar7 = 0;
          while( true ) {
            iVar3 = Curl_isalnum((uint)*pbVar4);
            if (iVar3 != 0) {
              plVar5 = &proto2num::protos[0].bit;
              goto LAB_00117da2;
            }
            bVar1 = *pbVar4;
            pbVar4 = pbVar4 + 1;
            if (bVar1 == 0x2b) break;
            bVar8 = true;
            iVar7 = 2;
            if (bVar1 != 0x3d) {
              if (bVar1 != 0x2d) {
                lVar6 = 1;
                goto LAB_00117e2d;
              }
              bVar8 = false;
              iVar7 = 1;
            }
          }
        } while( true );
      }
      lVar6 = 0;
LAB_00117e2d:
      free(__s);
    }
  }
  return lVar6;
LAB_00117da2:
  if (((sprotos *)(plVar5 + -1))->name == (char *)0x0) goto LAB_00117dbd;
  iVar3 = curl_strequal();
  if (iVar3 != 0) {
    uVar2 = *plVar5;
    if (iVar7 == 0) {
      *val = *val | uVar2;
    }
    else if (iVar7 == 2) {
      *val = uVar2;
    }
    else {
      *val = *val & ~uVar2;
    }
    goto LAB_00117e14;
  }
  plVar5 = plVar5 + 2;
  goto LAB_00117da2;
LAB_00117dbd:
  if (bVar8) {
    *val = 0;
  }
  warnf(config->global,"unrecognized protocol \'%s\'\n",pbVar4);
LAB_00117e14:
  pbVar4 = (byte *)strtok((char *)0x0,",");
  goto LAB_00117d57;
}

Assistant:

long proto2num(struct OperationConfig *config, long *val, const char *str)
{
  char *buffer;
  const char *sep = ",";
  char *token;

  static struct sprotos {
    const char *name;
    long bit;
  } const protos[] = {
    { "all", CURLPROTO_ALL },
    { "http", CURLPROTO_HTTP },
    { "https", CURLPROTO_HTTPS },
    { "ftp", CURLPROTO_FTP },
    { "ftps", CURLPROTO_FTPS },
    { "scp", CURLPROTO_SCP },
    { "sftp", CURLPROTO_SFTP },
    { "telnet", CURLPROTO_TELNET },
    { "ldap", CURLPROTO_LDAP },
    { "ldaps", CURLPROTO_LDAPS },
    { "dict", CURLPROTO_DICT },
    { "file", CURLPROTO_FILE },
    { "tftp", CURLPROTO_TFTP },
    { "imap", CURLPROTO_IMAP },
    { "imaps", CURLPROTO_IMAPS },
    { "pop3", CURLPROTO_POP3 },
    { "pop3s", CURLPROTO_POP3S },
    { "smtp", CURLPROTO_SMTP },
    { "smtps", CURLPROTO_SMTPS },
    { "rtsp", CURLPROTO_RTSP },
    { "gopher", CURLPROTO_GOPHER },
    { "smb", CURLPROTO_SMB },
    { "smbs", CURLPROTO_SMBS },
    { NULL, 0 }
  };

  if(!str)
    return 1;

  buffer = strdup(str); /* because strtok corrupts it */
  if(!buffer)
    return 1;

  /* Allow strtok() here since this isn't used threaded */
  /* !checksrc! disable BANNEDFUNC 2 */
  for(token = strtok(buffer, sep);
      token;
      token = strtok(NULL, sep)) {
    enum e_action { allow, deny, set } action = allow;

    struct sprotos const *pp;

    /* Process token modifiers */
    while(!ISALNUM(*token)) { /* may be NULL if token is all modifiers */
      switch (*token++) {
      case '=':
        action = set;
        break;
      case '-':
        action = deny;
        break;
      case '+':
        action = allow;
        break;
      default: /* Includes case of terminating NULL */
        Curl_safefree(buffer);
        return 1;
      }
    }

    for(pp = protos; pp->name; pp++) {
      if(curl_strequal(token, pp->name)) {
        switch(action) {
        case deny:
          *val &= ~(pp->bit);
          break;
        case allow:
          *val |= pp->bit;
          break;
        case set:
          *val = pp->bit;
          break;
        }
        break;
      }
    }

    if(!(pp->name)) { /* unknown protocol */
      /* If they have specified only this protocol, we say treat it as
         if no protocols are allowed */
      if(action == set)
        *val = 0;
      warnf(config->global, "unrecognized protocol '%s'\n", token);
    }
  }
  Curl_safefree(buffer);
  return 0;
}